

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O1

int __thiscall
asio::detail::reactive_socket_service_base::listen
          (reactive_socket_service_base *this,int __fd,int __n)

{
  int iVar1;
  int *piVar2;
  error_code *in_RCX;
  undefined4 in_register_00000034;
  int __fd_00;
  
  __fd_00 = *(int *)CONCAT44(in_register_00000034,__fd);
  if (__fd_00 == -1) {
    std::error_code::operator=(in_RCX,bad_descriptor);
  }
  else {
    iVar1 = ::listen(__fd_00,__n);
    if (iVar1 == 0) {
      in_RCX->_M_value = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (system_category()::instance == '\0') {
        listen(__fd_00,__n);
      }
      in_RCX->_M_value = iVar1;
      in_RCX->_M_cat = (error_category *)&system_category()::instance;
    }
  }
  return in_RCX->_M_value;
}

Assistant:

asio::error_code listen(base_implementation_type& impl,
      int backlog, asio::error_code& ec)
  {
    socket_ops::listen(impl.socket_, backlog, ec);
    return ec;
  }